

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TBasicType glslang::getCorrespondingUnsignedType(TBasicType type)

{
  TBasicType local_c;
  TBasicType type_local;
  
  switch(type) {
  case EbtInt8:
    local_c = EbtUint8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                  ,0x67c,"TBasicType glslang::getCorrespondingUnsignedType(TBasicType)");
  case EbtInt16:
    local_c = EbtUint16;
    break;
  case EbtInt:
    local_c = EbtUint;
    break;
  case EbtInt64:
    local_c = EbtUint64;
  }
  return local_c;
}

Assistant:

static TBasicType getCorrespondingUnsignedType(TBasicType type)
{
    switch(type) {
    case EbtInt8:
        return EbtUint8;
    case EbtInt16:
        return EbtUint16;
    case EbtInt:
        return EbtUint;
    case EbtInt64:
        return EbtUint64;
    default:
        assert(false);
        return EbtNumTypes;
    }
}